

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsCompare.c
# Opt level: O2

void JsEqualityExpressionEqCompare(JsValue *x,JsValue *y,JsValue *res)

{
  JsValueEnum JVar1;
  int iVar2;
  JsValueEnum JVar3;
  bool bVar4;
  undefined1 local_40 [8];
  JsValue tmp;
  
  res->type = JS_BOOLEAN;
  JVar1 = x->type;
  JVar3 = y->type;
  if (JVar1 == JVar3) {
    switch(JVar1) {
    case JS_UNDEFINED:
    case JS_NULL:
      goto switchD_00110cc4_caseD_0;
    case JS_BOOLEAN:
      bVar4 = (x->u).boolean == (y->u).boolean;
      break;
    case JS_NUMBER:
      if ((!NAN((x->u).number)) && (!NAN((y->u).number))) {
        (res->u).boolean = -(uint)((x->u).number == (y->u).number) & 1;
        return;
      }
      goto LAB_00110e27;
    case JS_STRING:
      iVar2 = strcmp((x->u).string,(y->u).string);
      bVar4 = iVar2 == 0;
      break;
    case JS_OBJECT:
      bVar4 = (x->u).object == (y->u).object;
      break;
    default:
      JsAssert(0);
      JVar1 = x->type;
      JVar3 = y->type;
      goto LAB_00110d26;
    }
    *(uint *)&res->u = (uint)bVar4;
    return;
  }
LAB_00110d26:
  if ((JVar1 == JS_NULL && JVar3 == JS_UNDEFINED) || (JVar3 == JS_NULL && JVar1 == JS_UNDEFINED)) {
switchD_00110cc4_caseD_0:
    (res->u).boolean = 1;
    return;
  }
  if (JVar3 == JS_STRING && JVar1 == JS_NUMBER) {
LAB_00110d4f:
    JsToNumber(y,(JsValue *)local_40);
  }
  else {
    if ((JVar3 == JS_NUMBER && JVar1 == JS_STRING) || (JVar1 == JS_BOOLEAN)) {
      JsToNumber(x,(JsValue *)local_40);
LAB_00110d88:
      x = (JsValue *)local_40;
      goto LAB_00110d8e;
    }
    if (JVar3 == JS_BOOLEAN) goto LAB_00110d4f;
    if (JVar3 != JS_OBJECT || 1 < JVar1 - JS_NUMBER) {
      if (JVar1 != JS_OBJECT || 1 < JVar3 - JS_NUMBER) {
LAB_00110e27:
        (res->u).boolean = 0;
        return;
      }
      JsToPrimitive(x,(uint)(JVar3 != JS_STRING),(JsValue *)local_40);
      goto LAB_00110d88;
    }
    JsToPrimitive(y,(uint)(JVar1 != JS_STRING),(JsValue *)local_40);
  }
  y = (JsValue *)local_40;
LAB_00110d8e:
  JsEqualityExpressionEqCompare(x,y,res);
  return;
}

Assistant:

void JsEqualityExpressionEqCompare( struct JsValue *x, struct JsValue *y, 
		struct JsValue *res){
	struct JsValue tmp;
	int xtype, ytype;
	int hit;
	res->type = JS_BOOLEAN;
	if (x->type == y->type)
		switch (x->type){
		case JS_UNDEFINED:
		case JS_NULL:
			res->u.boolean = TRUE;
			return;
		case JS_NUMBER:
			if (isnan(x->u.number) || isnan(y->u.number))
				res->u.boolean = FALSE;
			else
				res->u.boolean =  (x->u.number == y->u.number ? TRUE : FALSE);
			return;
		case JS_STRING:
			res->u.boolean = (strcmp(x->u.string,y->u.string) == 0 ? TRUE: FALSE);
			return;
		case JS_BOOLEAN:
			res->u.boolean = (x->u.boolean == y->u.boolean ? TRUE : FALSE);
			return;
		case JS_OBJECT:
			//refer the same object
			res->u.boolean = (x->u.object == y->u.object ? TRUE: FALSE);
			return;
		default:
			//未发现正确的类型
			JsAssert(FALSE);
		}
	xtype = x->type;
	ytype = y->type;
	if (xtype == JS_NULL && ytype == JS_UNDEFINED)
			res->u.boolean = TRUE;
	else if (xtype == JS_UNDEFINED && ytype == JS_NULL)
			res->u.boolean = TRUE;
	else if (xtype == JS_NUMBER && ytype == JS_STRING) {
			JsToNumber(y, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if (xtype == JS_STRING && ytype == JS_NUMBER) {
			JsToNumber(x, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else if (xtype == JS_BOOLEAN) {
			JsToNumber( x, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else if (ytype == JS_BOOLEAN){
			JsToNumber(y, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if ((xtype == JS_STRING || xtype == JS_NUMBER) &&
				ytype == JS_OBJECT) {
			if(xtype == JS_STRING)
				hit = JS_OBJECT_HIT_TYPE_STRING;
			else
				hit = JS_OBJECT_HIT_TYPE_NUMBER;
				
			JsToPrimitive(y, hit, &tmp);
			JsEqualityExpressionEqCompare(x, &tmp, res);
	} else if ((ytype == JS_STRING || ytype == JS_NUMBER) &&
				xtype == JS_OBJECT){
				
			if(ytype == JS_STRING)
				hit = JS_OBJECT_HIT_TYPE_STRING;
			else
				hit = JS_OBJECT_HIT_TYPE_NUMBER;
				
			JsToPrimitive(x, hit, &tmp);
			JsEqualityExpressionEqCompare(&tmp, y, res);
	} else{
		res->u.boolean  = FALSE;
	}
}